

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InvertDatabase.cc
# Opt level: O0

int __thiscall InvertDatabase::make_l1_pass(InvertDatabase *this)

{
  value_type vVar1;
  Env *this_00;
  Env *pEVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  element_type *peVar6;
  element_type *peVar7;
  element_type *peVar8;
  element_type *peVar9;
  reference pvVar10;
  ostream *poVar11;
  shared_ptr<std::vector<int,_std::allocator<int>_>_> local_98;
  shared_ptr<std::vector<int,_std::allocator<int>_>_> local_88;
  char local_75;
  int local_74;
  undefined1 local_70 [3];
  char lflg;
  int cid;
  int *local_60;
  int *ival_data;
  undefined1 local_48 [8];
  shared_ptr<std::vector<int,_std::allocator<int>_>_> ival;
  int ivalsz;
  ostringstream *idlstrm;
  ostringstream *seqstrm;
  int bsz;
  int supsz;
  int j;
  int i;
  InvertDatabase *this_local;
  
  seqstrm._0_4_ = 100;
  this_00 = this->env;
  pEVar2 = this->env;
  std::vector<int,_std::allocator<int>_>::resize(&this->backidx,100);
  peVar6 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->args);
  std::vector<int,_std::allocator<int>_>::resize(&this->fidx,(long)peVar6->dbase_max_item);
  this->numfreq = 0;
  ival.super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = 100;
  std::make_shared<std::vector<int,std::allocator<int>>,int&>((int *)local_48);
  supsz = 0;
  do {
    peVar6 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->args);
    if (peVar6->dbase_max_item <= supsz) {
      std::vector<int,_std::allocator<int>_>::resize(&this->backidx,(long)this->numfreq);
      std::shared_ptr<std::vector<int,_std::allocator<int>_>_>::shared_ptr(&local_98,(nullptr_t)0x0)
      ;
      std::shared_ptr<std::vector<int,_std::allocator<int>_>_>::operator=
                ((shared_ptr<std::vector<int,_std::allocator<int>_>_> *)local_48,&local_98);
      std::shared_ptr<std::vector<int,_std::allocator<int>_>_>::~shared_ptr(&local_98);
      iVar4 = this->numfreq;
      std::shared_ptr<std::vector<int,_std::allocator<int>_>_>::~shared_ptr
                ((shared_ptr<std::vector<int,_std::allocator<int>_>_> *)local_48);
      return iVar4;
    }
    peVar7 = std::__shared_ptr_access<Partition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Partition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &this->partition);
    iVar4 = Partition::partition_get_idxsup(peVar7,supsz);
    if (ival.super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._4_4_ < iVar4) {
      ival.super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._4_4_ = iVar4;
      peVar8 = std::
               __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_48);
      std::vector<int,_std::allocator<int>_>::resize
                (peVar8,(long)ival.
                              super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi._4_4_);
    }
    peVar8 = std::
             __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_48);
    local_60 = std::vector<int,_std::allocator<int>_>::data(peVar8);
    peVar7 = std::__shared_ptr_access<Partition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Partition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &this->partition);
    std::shared_ptr<std::vector<int,_std::allocator<int>_>_>::shared_ptr
              ((shared_ptr<std::vector<int,_std::allocator<int>_>_> *)local_70,
               (shared_ptr<std::vector<int,_std::allocator<int>_>_> *)local_48);
    Partition::partition_read_item
              (peVar7,(shared_ptr<std::vector<int,_std::allocator<int>_>_> *)local_70,supsz);
    std::shared_ptr<std::vector<int,_std::allocator<int>_>_>::~shared_ptr
              ((shared_ptr<std::vector<int,_std::allocator<int>_>_> *)local_70);
    bsz = 0;
    while( true ) {
      peVar9 = std::__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->cls);
      iVar5 = ClassInfo::get_num_class(peVar9);
      if (iVar5 <= bsz) break;
      peVar9 = std::__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->cls);
      ClassInfo::set_tmpe_item(peVar9,bsz,0);
      bsz = bsz + 1;
    }
    local_74 = -1;
    for (bsz = 0; bsz < iVar4; bsz = bsz + 2) {
      if (local_74 != local_60[bsz]) {
        peVar9 = std::__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->cls);
        ClassInfo::increase_tmpe(peVar9,bsz);
      }
      local_74 = local_60[bsz];
    }
    local_75 = '\0';
    pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](&this->fidx,(long)supsz);
    *pvVar10 = -1;
    bsz = 0;
    while( true ) {
      peVar9 = std::__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->cls);
      iVar5 = ClassInfo::get_num_class(peVar9);
      if (iVar5 <= bsz) break;
      peVar9 = std::__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->cls);
      bVar3 = ClassInfo::strong_esupport(peVar9,bsz);
      if (bVar3) {
        local_75 = '\x01';
        if ((int)seqstrm < this->numfreq + 1) {
          seqstrm._0_4_ = (int)seqstrm * 2;
          std::vector<int,_std::allocator<int>_>::resize(&this->backidx,(long)(int)seqstrm);
        }
        pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                            (&this->backidx,(long)this->numfreq);
        *pvVar10 = supsz;
        vVar1 = this->numfreq;
        pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](&this->fidx,(long)supsz);
        *pvVar10 = vVar1;
        this->numfreq = this->numfreq + 1;
        break;
      }
      bsz = bsz + 1;
    }
    if (local_75 != '\0') {
      bsz = 0;
      while( true ) {
        peVar9 = std::__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->cls);
        iVar5 = ClassInfo::get_num_class(peVar9);
        if (iVar5 <= bsz) break;
        peVar9 = std::__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->cls);
        iVar5 = ClassInfo::get_tmpe_item(peVar9,bsz);
        add_sup(this,iVar5,bsz);
        bsz = bsz + 1;
      }
      peVar6 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->args);
      if (peVar6->outputfreq != '\0') {
        poVar11 = (ostream *)std::ostream::operator<<(this_00,supsz);
        std::operator<<(poVar11," --");
        poVar11 = std::operator<<((ostream *)this_00," ");
        iVar5 = get_sup(this,supsz,-1);
        std::ostream::operator<<(poVar11,iVar5);
        bsz = 0;
        while( true ) {
          peVar9 = std::__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->cls);
          iVar5 = ClassInfo::get_num_class(peVar9);
          if (iVar5 <= bsz) break;
          poVar11 = std::operator<<((ostream *)this_00," ");
          peVar9 = std::__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->cls);
          iVar5 = ClassInfo::get_tmpe_item(peVar9,bsz);
          std::ostream::operator<<(poVar11,iVar5);
          bsz = bsz + 1;
        }
        std::operator<<((ostream *)this_00," ");
        peVar6 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->args);
        if (peVar6->print_tidlist != '\0') {
          std::shared_ptr<std::vector<int,_std::allocator<int>_>_>::shared_ptr
                    (&local_88,(shared_ptr<std::vector<int,_std::allocator<int>_>_> *)local_48);
          print_idlist(this,(ostream *)&pEVar2->idlstrm,&local_88,iVar4);
          std::shared_ptr<std::vector<int,_std::allocator<int>_>_>::~shared_ptr(&local_88);
        }
        std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      }
    }
    supsz = supsz + 1;
  } while( true );
}

Assistant:

int InvertDatabase::make_l1_pass() {
    int i, j;
    int supsz;
    int bsz = 100;

    ostringstream &seqstrm = env.seqstrm;
    ostringstream &idlstrm = env.idlstrm;

    backidx.resize(bsz);
    fidx.resize(args->dbase_max_item);

    numfreq = 0;
    int ivalsz = 100;
    shared_ptr<vint> ival = make_shared<vint>(ivalsz);
//   int tt=0;
    for (i = 0; i < args->dbase_max_item; i++) {
        supsz = partition->partition_get_idxsup(i);
        if (ivalsz < supsz) {
            ivalsz = supsz;
            ival->resize(ivalsz);
        }
        int *ival_data = ival->data();
        partition->partition_read_item(ival, i);
        for (j = 0; j < cls->get_num_class(); j++) {
            cls->set_tmpe_item(j, 0);
        }

        int cid = -1;
        for (j = 0; j < supsz; j += 2) {
            if (cid != ival_data[j]) {
                cls->increase_tmpe(j);
            }
            cid = ival_data[j];
        }

        char lflg = 0;
        fidx[i] = -1;       // default init
        for (j = 0; j < cls->get_num_class(); j++) {
            if (cls->strong_esupport(j)) {
                lflg = 1;
                if (numfreq + 1 > bsz) {
                    bsz = 2 * bsz;
                    backidx.resize(bsz);
                }
                backidx[numfreq] = i;
                fidx[i] = numfreq;
                //   cls->TMPE[j] << endl;
                numfreq++;
                break;
            }
        }

        if (lflg) {
            for (j = 0; j < cls->get_num_class(); j++)
                add_sup(cls->get_tmpe_item(j), j);
            if (args->outputfreq) {
                seqstrm << i << " --";
                seqstrm << " " << get_sup(i);
                for (j = 0; j < cls->get_num_class(); j++)
                    seqstrm << " " << cls->get_tmpe_item(j);
                seqstrm << " ";
                if (args->print_tidlist) print_idlist(idlstrm, ival, supsz);
                seqstrm << endl;
            }
        }
    }

    backidx.resize(numfreq);
    ival = nullptr;

    return numfreq;
}